

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O1

compile_errcode __thiscall Expression::Generate(Expression *this,string *expression_string)

{
  bool bVar1;
  bool bVar2;
  SymbolName SVar3;
  int iVar4;
  PcodeType op;
  string term_string1;
  string temp;
  string term_string2;
  string add_identity;
  Pcode pcode;
  string local_208;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  Term *local_1c8;
  string local_1c0;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  string *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined1 *local_f8;
  _Alloc_hider local_f0;
  undefined1 local_e8 [8];
  char local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Alloc_hider local_90;
  char local_80 [16];
  string local_70;
  string local_50;
  
  local_1a0 = local_190;
  local_180 = expression_string;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"0","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_1a0,local_1a0 + local_198);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  op = ADD;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1e8 = local_1d8;
  local_1e0 = 0;
  local_1d8[0] = 0;
  local_1c8 = &this->m_term;
  iVar4 = 0;
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar4 == 0) {
      if (1 < SVar3 - ADD_SYM) {
        if (op == SUB) {
          Term::Generate(local_1c8,&local_1c0);
          PcodeGenerator::GetNextTemp_abi_cxx11_((string *)&local_f8,pcode_generator);
          std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_f8);
          if (local_f8 != local_e8) {
            operator_delete(local_f8);
          }
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_1e8,local_1e8 + local_1e0);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_208._M_dataplus._M_p,
                     local_208._M_dataplus._M_p + local_208._M_string_length);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_1c0._M_dataplus._M_p,
                     local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
          Pcode::Pcode((Pcode *)&local_f8,SUB,&local_118,&local_138,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          std::vector<Pcode,_std::allocator<Pcode>_>::push_back
                    (&pcode_generator->m_pcode_queue,(Pcode *)&local_f8);
          std::__cxx11::string::_M_assign((string *)&local_208);
          goto LAB_00149977;
        }
        Term::Generate(local_1c8,&local_208);
        goto LAB_001499ee;
      }
      if (SVar3 == SUB_SYM) {
        op = SUB;
      }
      bVar1 = false;
      iVar4 = 0;
LAB_001499f6:
      bVar2 = true;
      if (!bVar1) {
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
    }
    else {
      if (iVar4 != 1) {
        Term::Generate(local_1c8,&local_1c0);
        PcodeGenerator::GetNextTemp_abi_cxx11_((string *)&local_f8,pcode_generator);
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_f8);
        if (local_f8 != local_e8) {
          operator_delete(local_f8);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_1e8,local_1e8 + local_1e0);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_208._M_dataplus._M_p,
                   local_208._M_dataplus._M_p + local_208._M_string_length);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_1c0._M_dataplus._M_p,
                   local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
        Pcode::Pcode((Pcode *)&local_f8,op,&local_158,&local_178,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        std::vector<Pcode,_std::allocator<Pcode>_>::push_back
                  (&pcode_generator->m_pcode_queue,(Pcode *)&local_f8);
        std::__cxx11::string::_M_assign((string *)&local_208);
LAB_00149977:
        if (local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if (local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p);
        }
        if (local_d0._M_p != local_c0) {
          operator_delete(local_d0._M_p);
        }
        if (local_f0._M_p != local_e0) {
          operator_delete(local_f0._M_p);
        }
LAB_001499ee:
        iVar4 = 1;
        bVar1 = true;
        goto LAB_001499f6;
      }
      if (SVar3 - ADD_SYM < 2) {
        op = (PcodeType)(SVar3 != ADD_SYM);
        iVar4 = 2;
        bVar1 = false;
        goto LAB_001499f6;
      }
      std::__cxx11::string::_M_assign((string *)local_180);
      iVar4 = 1;
      bVar2 = false;
    }
    if (!bVar2) {
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if (local_1a0 != local_190) {
        operator_delete(local_1a0);
      }
      return 0;
    }
  } while( true );
}

Assistant:

compile_errcode Expression::Generate(string& expression_string) {
    int ret = COMPILE_OK;
    int state = 0;
    string add_identity("0");
    string term_string1 = add_identity;
    string term_string2;
    string temp;
    PcodeType pcode_type = ADD;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsAddOperation(name)) {
                    if (name == SUB_SYM) {
                        pcode_type = SUB;
                    }
                    state = 0;
                    break;
                } else {
                    if (pcode_type == SUB) {
                        m_term.Generate(term_string2);
                        temp = pcode_generator->GetNextTemp();
                        Pcode pcode(SUB, temp, term_string1, term_string2);
                        pcode_generator->Insert(pcode);
                        term_string1 = temp;
                    } else {
                        m_term.Generate(term_string1);
                    }
                    state = 1;
                    break;
                }
            }
            case 1: {
                if (IsAddOperation(name)) {
                    if (name == ADD_SYM) {
                        pcode_type = ADD;
                    } else {
                        pcode_type = SUB;
                    }
                    state = 2;
                    break;
                } else {
                    expression_string = term_string1;
                    return COMPILE_OK;
                }
            }
            case 2: {
                m_term.Generate(term_string2);
                temp = pcode_generator->GetNextTemp();
                Pcode pcode(pcode_type, temp, term_string1, term_string2);
                pcode_generator->Insert(pcode);
                term_string1 = temp;
                state = 1;
            }
        }
        if (state != 1) {
            handle_correct_queue->NextSymbol();
        }
    }
}